

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void c4::mem_repeat(void *dest,void *pattern,size_t pattern_size,size_t num_times)

{
  bool bVar1;
  error_flags eVar2;
  void *pvVar3;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t n;
  char *end;
  char *begin;
  bool local_69;
  size_t local_68;
  
  if (in_RCX != 0) {
    local_69 = in_RDI < (void *)((long)in_RSI + in_RDX) &&
               in_RSI < (void *)((long)in_RDI + in_RCX * in_RDX);
    if (local_69) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3f0daf,(char *)0x433c,"check failed: %s",
                   "! mem_overlaps(dest, pattern, num_times*pattern_size, pattern_size)");
    }
    pvVar3 = (void *)((long)in_RDI + in_RCX * in_RDX);
    memcpy(in_RDI,in_RSI,in_RDX);
    for (local_68 = in_RDX; (void *)((long)in_RDI + local_68 * 2) < pvVar3; local_68 = local_68 << 1
        ) {
      memcpy((void *)((long)in_RDI + local_68),in_RDI,local_68);
    }
    if ((void *)((long)in_RDI + local_68) < pvVar3) {
      memcpy((void *)((long)in_RDI + local_68),in_RDI,(long)pvVar3 - ((long)in_RDI + local_68));
    }
  }
  return;
}

Assistant:

void mem_repeat(void* dest, void const* pattern, size_t pattern_size, size_t num_times)
{
    if(C4_UNLIKELY(num_times == 0))
        return;
    C4_ASSERT( ! mem_overlaps(dest, pattern, num_times*pattern_size, pattern_size));
    char *begin = (char*)dest;
    char *end   = begin + num_times * pattern_size;
    // copy the pattern once
    ::memcpy(begin, pattern, pattern_size);
    // now copy from dest to itself, doubling up every time
    size_t n = pattern_size;
    while(begin + 2*n < end)
    {
        ::memcpy(begin + n, begin, n);
        n <<= 1; // double n
    }
    // copy the missing part
    if(begin + n < end)
    {
        ::memcpy(begin + n, begin, static_cast<size_t>(end - (begin + n)));
    }
}